

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::InspectInstrForMemSetCandidate
          (GlobOpt *this,Loop *loop,Instr *instr,MemSetEmitData *emitData,bool *errorInInstr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  SymID SVar4;
  BailOutKind BVar5;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  IndirOpnd *pIVar9;
  StackSym *pSVar10;
  JITTimeFunctionBody *pJVar11;
  char16 *pcVar12;
  char16 *pcVar13;
  GlobOpt *pGVar14;
  char16_t *form;
  MemOpCandidate *pMVar15;
  wchar local_98 [4];
  char16 debugStringBuffer [42];
  
  if (((emitData == (MemSetEmitData *)0x0) ||
      (pMVar15 = (emitData->super_MemOpEmitData).candidate, pMVar15 == (MemOpCandidate *)0x0)) ||
     (pMVar15->type != MEMSET)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4456,
                       "(emitData && emitData->candidate && emitData->candidate->IsMemSet())",
                       "emitData && emitData->candidate && emitData->candidate->IsMemSet()");
    if (!bVar3) goto LAB_0044475f;
    *puVar8 = 0;
    pMVar15 = (emitData->super_MemOpEmitData).candidate;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 == LdElemI_A) {
    if (DAT_0145948a != '\x01') goto LAB_0044474b;
    uVar6 = Func::GetSourceContextId(this->func);
    uVar7 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar6,uVar7);
    if (!bVar3) {
      uVar6 = Func::GetSourceContextId(this->func);
      uVar7 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemSetPhase,uVar6,uVar7);
      if (!bVar3) goto LAB_0044474b;
    }
    Output::Print(L"TRACE MemSet:");
    pJVar11 = Func::GetJITFunctionBody(this->func);
    pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
    pcVar13 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_98);
    uVar6 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar12,pcVar13,(ulong)uVar6);
    form = L"Orphan LdElemI_A detected";
  }
  else {
    if ((OVar1 != StElemI_A_Strict) && (OVar1 != StElemI_A)) {
      return false;
    }
    bVar3 = IR::Opnd::IsIndirOpnd(instr->m_dst);
    if (bVar3) {
      pIVar9 = IR::Opnd::AsIndirOpnd(instr->m_dst);
      pGVar14 = (GlobOpt *)pIVar9->m_baseOpnd;
      pSVar10 = IR::Opnd::GetStackSym((Opnd *)pGVar14);
      SVar4 = GetVarSymID(pGVar14,pSVar10);
      if (SVar4 == pMVar15->base) {
        pIVar9 = IR::Opnd::AsIndirOpnd(instr->m_dst);
        pGVar14 = (GlobOpt *)pIVar9->m_indexOpnd;
        pSVar10 = IR::Opnd::GetStackSym((Opnd *)pGVar14);
        SVar4 = GetVarSymID(pGVar14,pSVar10);
        if (SVar4 == pMVar15->index) {
          if (instr->m_kind != InstrKindProfiled) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar8 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x445f,"(instr->IsProfiledInstr())","instr->IsProfiledInstr()");
            if (!bVar3) {
LAB_0044475f:
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar8 = 0;
          }
          (emitData->super_MemOpEmitData).stElemInstr = instr;
          BVar5 = IR::Instr::GetBailOutKind(instr);
          (emitData->super_MemOpEmitData).bailOutKind = BVar5;
          return true;
        }
      }
    }
    if (DAT_0145948a != '\x01') goto LAB_0044474b;
    uVar6 = Func::GetSourceContextId(this->func);
    uVar7 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemOpPhase,uVar6,uVar7);
    if (!bVar3) {
      uVar6 = Func::GetSourceContextId(this->func);
      uVar7 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,MemSetPhase,uVar6,uVar7);
      if (!bVar3) goto LAB_0044474b;
    }
    Output::Print(L"TRACE MemSet:");
    pJVar11 = Func::GetJITFunctionBody(this->func);
    pcVar12 = JITTimeFunctionBody::GetDisplayName(pJVar11);
    pcVar13 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])local_98);
    uVar6 = Loop::GetLoopNumber(loop);
    Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar12,pcVar13,(ulong)uVar6);
    form = L"Orphan StElemI_A detected";
  }
  Output::Print(form);
  IR::Instr::DumpByteCodeOffset(instr);
  pcVar12 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
  Output::Print(L" (%s)",pcVar12);
  Output::Print(L"\n");
  Output::Flush();
LAB_0044474b:
  *errorInInstr = true;
  return false;
}

Assistant:

bool
GlobOpt::InspectInstrForMemSetCandidate(Loop* loop, IR::Instr* instr, MemSetEmitData* emitData, bool& errorInInstr)
{
    Assert(emitData && emitData->candidate && emitData->candidate->IsMemSet());
    Loop::MemSetCandidate* candidate = (Loop::MemSetCandidate*)emitData->candidate;
    if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
    {
        if (instr->GetDst()->IsIndirOpnd()
            && (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetStackSym()) == candidate->base)
            && (GetVarSymID(instr->GetDst()->AsIndirOpnd()->GetIndexOpnd()->GetStackSym()) == candidate->index)
            )
        {
            Assert(instr->IsProfiledInstr());
            emitData->stElemInstr = instr;
            emitData->bailOutKind = instr->GetBailOutKind();
            return true;
        }
        TRACE_MEMOP_PHASE_VERBOSE(MemSet, loop, instr, _u("Orphan StElemI_A detected"));
        errorInInstr = true;
    }
    else if (instr->m_opcode == Js::OpCode::LdElemI_A)
    {
        TRACE_MEMOP_PHASE_VERBOSE(MemSet, loop, instr, _u("Orphan LdElemI_A detected"));
        errorInInstr = true;
    }
    return false;
}